

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QLocaleData::applyIntegerFormatting
          (QString *__return_storage_ptr__,QLocaleData *this,QString *numStr,bool negative,
          int precision,int base,int width,uint flags)

{
  bool bVar1;
  size_t i;
  ulong uVar2;
  int iVar3;
  qsizetype i_1;
  undefined1 *puVar4;
  long lVar5;
  long lVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  GroupSizes GVar8;
  undefined1 *puStack_100;
  QArrayDataPointer<char16_t> local_c8;
  QStringBuilder<QString,_const_QStringView_&> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QStringView local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (base == 10) {
    zeroDigit((QString *)&local_58,this);
  }
  else {
    local_58.d = (Data *)0x0;
    local_a8.a.d.d = (Data *)0x0;
    local_a8.a.d.ptr = (char16_t *)0x0;
    local_58.ptr = L"0";
    local_a8.a.d.size = 0;
    local_58.size = 1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  }
  qVar7 = local_58.size;
  uVar2 = (ulong)(numStr->d).size / (ulong)local_58.size;
  local_68.m_data = (char16_t *)0x0;
  local_68.m_size = (qsizetype)(undefined1 *)0x0;
  if ((char)flags < '\0') {
    if (base == 2) {
      local_68.m_data = L"0B";
      if ((flags >> 8 & 1) == 0) {
        local_68.m_data = L"0b";
      }
      for (puVar4 = (undefined1 *)0x0;
          (local_68.m_size = (qsizetype)(undefined1 *)0x3, puVar4 != (undefined1 *)0x3 &&
          (local_68.m_size = (qsizetype)puVar4, local_68.m_data[(long)puVar4] != L'\0'));
          puVar4 = puVar4 + 1) {
      }
    }
    else if (base == 8) {
      bVar1 = QString::startsWith(numStr,(QString *)&local_58,CaseSensitive);
      local_68.m_data = (char16_t *)0x0;
      local_68.m_size = (qsizetype)(undefined1 *)0x0;
      if (!bVar1) {
        local_68.m_data = local_58.ptr;
        local_68.m_size = local_58.size;
      }
    }
    else {
      local_68.m_data = (char16_t *)0x0;
      local_68.m_size = (qsizetype)(undefined1 *)0x0;
      if (base == 0x10) {
        local_68.m_data = L"0X";
        if ((flags >> 8 & 1) == 0) {
          local_68.m_data = L"0x";
        }
        puStack_100 = (undefined1 *)0x3;
        for (puVar4 = (undefined1 *)0x0;
            (local_68.m_size = (qsizetype)puStack_100, puVar4 != (undefined1 *)0x3 &&
            (local_68.m_size = (qsizetype)puVar4, local_68.m_data[(long)puVar4] != L'\0'));
            puVar4 = puVar4 + 1) {
        }
      }
    }
  }
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d._0_4_ = 0xaaaaaaaa;
  local_88.d._4_4_ = 0xaaaaaaaa;
  local_88.ptr._0_4_ = 0xaaaaaaaa;
  local_88.ptr._4_4_ = 0xaaaaaaaa;
  signPrefix((QString *)&local_c8,this,negative,flags);
  local_a8.a.d.size = local_c8.size;
  local_a8.a.d.ptr = local_c8.ptr;
  local_a8.a.d.d = local_c8.d;
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (char16_t *)0x0;
  local_c8.size = 0;
  local_a8.b = &local_68;
  QStringBuilder<QString,_const_QStringView_&>::convertTo<QString>((QString *)&local_88,&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  puVar4 = (undefined1 *)(local_88.size + uVar2);
  if ((flags & 0x20) != 0 && base == 10) {
    GVar8 = groupSizes(this);
    local_a8.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    groupSeparator(&local_a8.a,this);
    lVar5 = uVar2 - (uint)GVar8.least;
    if (GVar8.first <= lVar5) {
      QString::insert(numStr,lVar5 * qVar7,&local_a8.a);
      uVar2 = GVar8._0_8_ >> 0x20;
      while( true ) {
        puVar4 = puVar4 + 1;
        lVar6 = lVar5 - uVar2;
        if (lVar6 == 0 || lVar5 < (long)uVar2) break;
        QString::insert(numStr,lVar6 * qVar7,&local_a8.a);
        lVar5 = lVar6;
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  }
  iVar3 = 1;
  if (precision != -1) {
    iVar3 = precision;
  }
  for (qVar7 = (numStr->d).size; qVar7 < iVar3; qVar7 = qVar7 + 1) {
    QString::prepend(numStr,(QString *)&local_58);
    puVar4 = puVar4 + 1;
  }
  if ((flags & 6) == 2 && precision == -1) {
    for (; (long)puVar4 < (long)width; puVar4 = puVar4 + 1) {
      QString::prepend(numStr,(QString *)&local_58);
    }
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  if ((flags & 0x40) == 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&numStr->d);
  }
  else {
    QString::toUpper_helper(__return_storage_ptr__,numStr);
  }
  if ((undefined1 *)local_88.size != (undefined1 *)0x0) {
    QString::prepend(__return_storage_ptr__,(QString *)&local_88);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocaleData::applyIntegerFormatting(QString &&numStr, bool negative, int precision,
                                            int base, int width, unsigned flags) const
{
    const QString zero = base == 10 ? zeroDigit() : QStringLiteral("0");
    const auto digitWidth = zero.size();
    const auto digitCount = numStr.size() / digitWidth;

    const auto basePrefix = [&] () -> QStringView {
        if (flags & ShowBase) {
            const bool upper = flags & UppercaseBase;
            if (base == 16)
                return upper ? u"0X" : u"0x";
            if (base == 2)
                return upper ? u"0B" : u"0b";
            if (base == 8 && !numStr.startsWith(zero))
                return zero;
        }
        return {};
    }();

    const QString prefix = signPrefix(negative, flags) + basePrefix;
    // Count how much of width we've used up.  Each digit counts as one
    qsizetype usedWidth = digitCount + prefix.size();

    if (base == 10 && flags & GroupDigits) {
        const QLocaleData::GroupSizes grouping = groupSizes();
        const QString group = groupSeparator();
        qsizetype i = digitCount - grouping.least;
        if (i >= grouping.first) {
            numStr.insert(i * digitWidth, group);
            ++usedWidth;
            while ((i -= grouping.higher) > 0) {
                numStr.insert(i * digitWidth, group);
                ++usedWidth;
            }
        }
        // TODO: should we group any zero-padding we add later ?
    }

    const bool noPrecision = precision == -1;
    if (noPrecision)
        precision = 1;

    for (qsizetype i = numStr.size(); i < precision; ++i) {
        numStr.prepend(zero);
        usedWidth++;
    }

    // LeftAdjusted overrides ZeroPadded; and sprintf() only pads when
    // precision is not specified in the format string.
    if (noPrecision && flags & ZeroPadded && !(flags & LeftAdjusted)) {
        for (qsizetype i = usedWidth; i < width; ++i)
            numStr.prepend(zero);
    }

    QString result(flags & CapitalEorX ? std::move(numStr).toUpper() : std::move(numStr));
    if (prefix.size())
        result.prepend(prefix);
    return result;
}